

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.h
# Opt level: O3

void Persistent_Test_Hitter<8u>(string *PATH)

{
  long lVar1;
  __node_base *p_Var2;
  _Hash_node_base *p_Var3;
  char cVar4;
  __node_base _Var5;
  undefined8 *puVar6;
  value_type *__val;
  void *pvVar7;
  long *plVar8;
  WavingSketch<8U,_16U,_8U> *pWVar9;
  Small_Space<8U> *this;
  PIE<8U> *this_00;
  OO_FPI<8U> *this_01;
  ostream *poVar10;
  iterator iVar11;
  mapped_type *pmVar12;
  long *plVar13;
  __hashtable_alloc *p_Var14;
  basic_ostream<char,_std::char_traits<char>_> **out_1;
  undefined8 *puVar15;
  undefined8 *puVar16;
  long lVar17;
  uint uVar18;
  iterator __end3;
  uint64_t uVar19;
  undefined8 *puVar20;
  uint32_t j;
  int iVar21;
  ulong uVar22;
  int cnt;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  HashMap<8U> mp;
  string file;
  Data<8U> packet;
  Abstract<8U> *sketch [4];
  ofstream out;
  uint local_37c;
  _Hashtable<Data<8U>,_std::pair<const_Data<8U>,_int>,_std::allocator<std::pair<const_Data<8U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<8U>_>,_My_Hash<8U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_378;
  _Hashtable<Data<8U>,_std::pair<const_Data<8U>,_int>,_std::allocator<std::pair<const_Data<8U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<8U>_>,_My_Hash<8U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_340;
  undefined8 *local_308;
  undefined8 *local_300;
  undefined8 *local_2f8;
  int local_2ec;
  long *local_2e8 [2];
  long local_2d8 [2];
  Data<8U> *local_2c8;
  key_type local_2c0;
  WavingSketch<8U,_16U,_8U> *local_2b8;
  Small_Space<8U> *local_2b0;
  PIE<8U> *local_2a8;
  OO_FPI<8U> *local_2a0;
  undefined8 local_290;
  __hashtable_alloc *local_288;
  long local_280;
  uint64_t local_278;
  long local_270;
  _Hashtable<Data<8U>,_std::pair<const_Data<8U>,_int>,_std::allocator<std::pair<const_Data<8U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<8U>_>,_My_Hash<8U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_268;
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_Data<8U>,_int>,_true>_>_>
  local_230;
  long local_228;
  long local_220;
  long lStack_218;
  ios_base local_138 [264];
  
  local_308 = (undefined8 *)operator_new(0x20);
  local_300 = local_308 + 4;
  *local_308 = 0;
  local_308[1] = 0;
  local_308[2] = 0;
  local_308[3] = 0;
  local_2e8[0] = local_2d8;
  local_2f8 = local_300;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2e8,"caida","");
  pvVar7 = operator_new(0x200);
  local_378._M_buckets = &local_378._M_before_begin._M_nxt;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_378,RESULT_FOLDER_abi_cxx11_._M_dataplus._M_p,
             RESULT_FOLDER_abi_cxx11_._M_dataplus._M_p + RESULT_FOLDER_abi_cxx11_._M_string_length);
  std::__cxx11::string::append((char *)&local_378);
  plVar8 = (long *)std::__cxx11::string::_M_append((char *)&local_378,(ulong)local_2e8[0]);
  p_Var2 = &local_340._M_before_begin;
  plVar13 = plVar8 + 2;
  if ((__node_base *)*plVar8 == (__node_base *)plVar13) {
    local_340._M_before_begin._M_nxt = (_Hash_node_base *)*plVar13;
    local_340._M_element_count = plVar8[3];
    local_340._M_buckets = &p_Var2->_M_nxt;
  }
  else {
    local_340._M_before_begin._M_nxt = (_Hash_node_base *)*plVar13;
    local_340._M_buckets = (__buckets_ptr)*plVar8;
  }
  local_340._M_bucket_count = plVar8[1];
  *plVar8 = (long)plVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_340);
  p_Var14 = (__hashtable_alloc *)(plVar8 + 2);
  if ((__hashtable_alloc *)*plVar8 == p_Var14) {
    local_220 = *(long *)p_Var14;
    lStack_218 = plVar8[3];
    local_230._M_h = (__hashtable_alloc *)&local_220;
  }
  else {
    local_220 = *(long *)p_Var14;
    local_230._M_h = (__hashtable_alloc *)*plVar8;
  }
  local_228 = plVar8[1];
  *plVar8 = (long)p_Var14;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  std::ofstream::ofstream(pvVar7,(string *)&local_230,_S_out);
  *local_308 = pvVar7;
  if (local_230._M_h != (__hashtable_alloc *)&local_220) {
    operator_delete(local_230._M_h,local_220 + 1);
  }
  if ((__node_base *)local_340._M_buckets != p_Var2) {
    operator_delete(local_340._M_buckets,
                    (ulong)((long)&(local_340._M_before_begin._M_nxt)->_M_nxt + 1));
  }
  if ((__node_base *)local_378._M_buckets != &local_378._M_before_begin) {
    operator_delete(local_378._M_buckets,
                    (ulong)((long)&(local_378._M_before_begin._M_nxt)->_M_nxt + 1));
  }
  pvVar7 = operator_new(0x200);
  local_378._M_buckets = &local_378._M_before_begin._M_nxt;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_378,RESULT_FOLDER_abi_cxx11_._M_dataplus._M_p,
             RESULT_FOLDER_abi_cxx11_._M_dataplus._M_p + RESULT_FOLDER_abi_cxx11_._M_string_length);
  std::__cxx11::string::append((char *)&local_378);
  plVar8 = (long *)std::__cxx11::string::_M_append((char *)&local_378,(ulong)local_2e8[0]);
  plVar13 = plVar8 + 2;
  if ((__node_base *)*plVar8 == (__node_base *)plVar13) {
    local_340._M_before_begin._M_nxt = (_Hash_node_base *)*plVar13;
    local_340._M_element_count = plVar8[3];
    local_340._M_buckets = &p_Var2->_M_nxt;
  }
  else {
    local_340._M_before_begin._M_nxt = (_Hash_node_base *)*plVar13;
    local_340._M_buckets = (__buckets_ptr)*plVar8;
  }
  local_340._M_bucket_count = plVar8[1];
  *plVar8 = (long)plVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_340);
  p_Var14 = (__hashtable_alloc *)(plVar8 + 2);
  if ((__hashtable_alloc *)*plVar8 == p_Var14) {
    local_220 = *(long *)p_Var14;
    lStack_218 = plVar8[3];
    local_230._M_h = (__hashtable_alloc *)&local_220;
  }
  else {
    local_220 = *(long *)p_Var14;
    local_230._M_h = (__hashtable_alloc *)*plVar8;
  }
  local_228 = plVar8[1];
  *plVar8 = (long)p_Var14;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  std::ofstream::ofstream(pvVar7,(string *)&local_230,_S_out);
  local_308[1] = pvVar7;
  if (local_230._M_h != (__hashtable_alloc *)&local_220) {
    operator_delete(local_230._M_h,local_220 + 1);
  }
  if ((__node_base *)local_340._M_buckets != p_Var2) {
    operator_delete(local_340._M_buckets,
                    (ulong)((long)&(local_340._M_before_begin._M_nxt)->_M_nxt + 1));
  }
  if ((__node_base *)local_378._M_buckets != &local_378._M_before_begin) {
    operator_delete(local_378._M_buckets,
                    (ulong)((long)&(local_378._M_before_begin._M_nxt)->_M_nxt + 1));
  }
  pvVar7 = operator_new(0x200);
  local_378._M_buckets = &local_378._M_before_begin._M_nxt;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_378,RESULT_FOLDER_abi_cxx11_._M_dataplus._M_p,
             RESULT_FOLDER_abi_cxx11_._M_dataplus._M_p + RESULT_FOLDER_abi_cxx11_._M_string_length);
  std::__cxx11::string::append((char *)&local_378);
  plVar8 = (long *)std::__cxx11::string::_M_append((char *)&local_378,(ulong)local_2e8[0]);
  plVar13 = plVar8 + 2;
  if ((__node_base *)*plVar8 == (__node_base *)plVar13) {
    local_340._M_before_begin._M_nxt = (_Hash_node_base *)*plVar13;
    local_340._M_element_count = plVar8[3];
    local_340._M_buckets = &p_Var2->_M_nxt;
  }
  else {
    local_340._M_before_begin._M_nxt = (_Hash_node_base *)*plVar13;
    local_340._M_buckets = (__buckets_ptr)*plVar8;
  }
  local_340._M_bucket_count = plVar8[1];
  *plVar8 = (long)plVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_340);
  p_Var14 = (__hashtable_alloc *)(plVar8 + 2);
  if ((__hashtable_alloc *)*plVar8 == p_Var14) {
    local_220 = *(long *)p_Var14;
    lStack_218 = plVar8[3];
    local_230._M_h = (__hashtable_alloc *)&local_220;
  }
  else {
    local_220 = *(long *)p_Var14;
    local_230._M_h = (__hashtable_alloc *)*plVar8;
  }
  local_228 = plVar8[1];
  *plVar8 = (long)p_Var14;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  std::ofstream::ofstream(pvVar7,(string *)&local_230,_S_out);
  local_308[2] = pvVar7;
  if (local_230._M_h != (__hashtable_alloc *)&local_220) {
    operator_delete(local_230._M_h,local_220 + 1);
  }
  if ((__node_base *)local_340._M_buckets != p_Var2) {
    operator_delete(local_340._M_buckets,
                    (ulong)((long)&(local_340._M_before_begin._M_nxt)->_M_nxt + 1));
  }
  if ((__node_base *)local_378._M_buckets != &local_378._M_before_begin) {
    operator_delete(local_378._M_buckets,
                    (ulong)((long)&(local_378._M_before_begin._M_nxt)->_M_nxt + 1));
  }
  pvVar7 = operator_new(0x200);
  local_378._M_buckets = &local_378._M_before_begin._M_nxt;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_378,RESULT_FOLDER_abi_cxx11_._M_dataplus._M_p,
             RESULT_FOLDER_abi_cxx11_._M_dataplus._M_p + RESULT_FOLDER_abi_cxx11_._M_string_length);
  std::__cxx11::string::append((char *)&local_378);
  plVar8 = (long *)std::__cxx11::string::_M_append((char *)&local_378,(ulong)local_2e8[0]);
  plVar13 = plVar8 + 2;
  if ((__node_base *)*plVar8 == (__node_base *)plVar13) {
    local_340._M_before_begin._M_nxt = (_Hash_node_base *)*plVar13;
    local_340._M_element_count = plVar8[3];
    local_340._M_buckets = &p_Var2->_M_nxt;
  }
  else {
    local_340._M_before_begin._M_nxt = (_Hash_node_base *)*plVar13;
    local_340._M_buckets = (__buckets_ptr)*plVar8;
  }
  local_340._M_bucket_count = plVar8[1];
  *plVar8 = (long)plVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_340);
  p_Var14 = (__hashtable_alloc *)(plVar8 + 2);
  if ((__hashtable_alloc *)*plVar8 == p_Var14) {
    local_220 = *(long *)p_Var14;
    lStack_218 = plVar8[3];
    local_230._M_h = (__hashtable_alloc *)&local_220;
  }
  else {
    local_220 = *(long *)p_Var14;
    local_230._M_h = (__hashtable_alloc *)*plVar8;
  }
  local_228 = plVar8[1];
  *plVar8 = (long)p_Var14;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  std::ofstream::ofstream(pvVar7,(string *)&local_230,_S_out);
  local_308[3] = pvVar7;
  if (local_230._M_h != (__hashtable_alloc *)&local_220) {
    operator_delete(local_230._M_h,local_220 + 1);
  }
  if ((__node_base *)local_340._M_buckets != p_Var2) {
    operator_delete(local_340._M_buckets,
                    (ulong)((long)&(local_340._M_before_begin._M_nxt)->_M_nxt + 1));
  }
  if ((__node_base *)local_378._M_buckets != &local_378._M_before_begin) {
    operator_delete(local_378._M_buckets,
                    (ulong)((long)&(local_378._M_before_begin._M_nxt)->_M_nxt + 1));
  }
  local_2c8 = read_standard_data<8u>((PATH->_M_dataplus)._M_p,record_length,(int *)&local_37c);
  uVar18 = 10000000;
  if ((int)local_37c < 10000000) {
    uVar18 = local_37c;
  }
  local_288 = _VTT;
  local_290 = _log;
  lVar17 = 0;
  local_37c = uVar18;
  do {
    lVar1 = lVar17 + 1;
    local_2ec = (int)lVar1 * 0x28;
    local_270 = lVar17;
    printf("\x1b[0m\x1b[1;4;36m> Memory size: %dKB\n\x1b[0m");
    pWVar9 = (WavingSketch<8U,_16U,_8U> *)operator_new(0xa8);
    uVar19 = lVar1 * 40000;
    WavingSketch<8U,_16U,_8U>::WavingSketch(pWVar9,(int)uVar19,0xf3,3);
    local_2b8 = pWVar9;
    this = (Small_Space<8U> *)operator_new(0xb0);
    Small_Space<8U>::Small_Space(this,(int)uVar19,0xf3);
    local_2b0 = this;
    this_00 = (PIE<8U> *)operator_new(0x80);
    PIE<8U>::PIE(this_00,(int)lVar1 * 8000000,0xf3,0x640);
    local_2a8 = this_00;
    this_01 = (OO_FPI<8U> *)operator_new(0x98);
    local_280 = lVar1;
    local_278 = uVar19;
    OO_FPI<8U>::OO_FPI(this_01,uVar19,0xf3);
    puVar6 = local_300;
    local_2a0 = this_01;
    puVar16 = local_308;
    puVar20 = local_300;
    iVar21 = local_2ec;
    if (local_270 == 0) {
      puVar15 = local_308;
      if (local_308 != local_300) {
        do {
          poVar10 = (ostream *)*puVar15;
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"MEM(KB)",7);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,",",1);
          lVar17 = 0;
          do {
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)*puVar15,
                                 ((&local_2b8)[lVar17]->super_Abstract<8U>).name._M_dataplus._M_p,
                                 ((&local_2b8)[lVar17]->super_Abstract<8U>).name._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,",",1);
            lVar17 = lVar17 + 1;
          } while (lVar17 != 4);
          cVar4 = (char)(long *)*puVar15;
          std::ios::widen((char)*(undefined8 *)(*(long *)*puVar15 + -0x18) + cVar4);
          std::ostream::put(cVar4);
          std::ostream::flush();
          puVar15 = puVar15 + 1;
          puVar16 = local_308;
          puVar20 = local_300;
          iVar21 = local_2ec;
        } while (puVar15 != puVar6);
        goto LAB_00107d84;
      }
    }
    else {
LAB_00107d84:
      for (; puVar16 != puVar20; puVar16 = puVar16 + 1) {
        poVar10 = (ostream *)std::ostream::operator<<((ostream *)*puVar16,iVar21);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,",",1);
      }
    }
    local_340._M_buckets = &local_340._M_single_bucket;
    local_340._M_bucket_count = 1;
    local_340._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_340._M_element_count = 0;
    local_340._M_rehash_policy._M_max_load_factor = 1.0;
    local_340._M_rehash_policy._M_next_resize = 0;
    local_340._M_single_bucket = (__node_base_ptr)0x0;
    local_378._M_buckets = &local_378._M_single_bucket;
    local_378._M_bucket_count = 1;
    local_378._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_378._M_element_count = 0;
    local_378._M_rehash_policy._M_max_load_factor = 1.0;
    local_378._M_rehash_policy._M_next_resize = 0;
    local_378._M_single_bucket = (__node_base_ptr)0x0;
    local_2c0.str[0] = '\0';
    local_2c0.str[1] = '\0';
    local_2c0.str[2] = '\0';
    local_2c0.str[3] = '\0';
    local_2c0.str[4] = '\0';
    local_2c0.str[5] = '\0';
    local_2c0.str[6] = '\0';
    local_2c0.str[7] = '\0';
    if (local_37c != 0) {
      uVar22 = 0;
      uVar18 = 0;
      do {
        local_2c0.str = *&local_2c8[uVar22].str;
        _Var5._M_nxt = local_378._M_before_begin._M_nxt;
        if ((uint)((int)uVar22 * -0x36b834f) < 0x35abe) {
          while (_Var5._M_nxt != (_Hash_node_base *)0x0) {
            p_Var3 = (_Var5._M_nxt)->_M_nxt;
            operator_delete(_Var5._M_nxt,0x20);
            _Var5._M_nxt = p_Var3;
          }
          uVar18 = uVar18 + 1;
          memset(local_378._M_buckets,0,local_378._M_bucket_count << 3);
          local_378._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          local_378._M_element_count = 0;
        }
        iVar11 = std::
                 _Hashtable<Data<8U>,_std::pair<const_Data<8U>,_int>,_std::allocator<std::pair<const_Data<8U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<8U>_>,_My_Hash<8U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(&local_340,&local_2c0);
        if (iVar11.super__Node_iterator_base<std::pair<const_Data<8U>,_int>,_true>._M_cur ==
            (__node_type *)0x0) {
          pmVar12 = std::__detail::
                    _Map_base<Data<8U>,_std::pair<const_Data<8U>,_int>,_std::allocator<std::pair<const_Data<8U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<8U>_>,_My_Hash<8U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<Data<8U>,_std::pair<const_Data<8U>,_int>,_std::allocator<std::pair<const_Data<8U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<8U>_>,_My_Hash<8U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)&local_340,&local_2c0);
          *pmVar12 = 1;
          pmVar12 = std::__detail::
                    _Map_base<Data<8U>,_std::pair<const_Data<8U>,_int>,_std::allocator<std::pair<const_Data<8U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<8U>_>,_My_Hash<8U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<Data<8U>,_std::pair<const_Data<8U>,_int>,_std::allocator<std::pair<const_Data<8U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<8U>_>,_My_Hash<8U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)&local_378,&local_2c0);
          *pmVar12 = 1;
        }
        else {
          iVar11 = std::
                   _Hashtable<Data<8U>,_std::pair<const_Data<8U>,_int>,_std::allocator<std::pair<const_Data<8U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<8U>_>,_My_Hash<8U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find(&local_378,&local_2c0);
          if (iVar11.super__Node_iterator_base<std::pair<const_Data<8U>,_int>,_true>._M_cur ==
              (__node_type *)0x0) {
            pmVar12 = std::__detail::
                      _Map_base<Data<8U>,_std::pair<const_Data<8U>,_int>,_std::allocator<std::pair<const_Data<8U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<8U>_>,_My_Hash<8U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<Data<8U>,_std::pair<const_Data<8U>,_int>,_std::allocator<std::pair<const_Data<8U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<8U>_>,_My_Hash<8U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)&local_378,&local_2c0);
            *pmVar12 = 1;
            pmVar12 = std::__detail::
                      _Map_base<Data<8U>,_std::pair<const_Data<8U>,_int>,_std::allocator<std::pair<const_Data<8U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<8U>_>,_My_Hash<8U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<Data<8U>,_std::pair<const_Data<8U>,_int>,_std::allocator<std::pair<const_Data<8U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<8U>_>,_My_Hash<8U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)&local_340,&local_2c0);
            *pmVar12 = *pmVar12 + 1;
          }
        }
        uVar22 = uVar22 + 1;
        lVar17 = 0;
        do {
          (*((&local_2b8)[lVar17]->super_Abstract<8U>)._vptr_Abstract[7])
                    ((&local_2b8)[lVar17],&local_2c0,(ulong)uVar18);
          lVar17 = lVar17 + 1;
        } while (lVar17 != 4);
      } while (uVar22 < local_37c);
    }
    lVar17 = 0;
    do {
      pWVar9 = (&local_2b8)[lVar17];
      local_268._M_buckets = (__buckets_ptr)0x0;
      local_268._M_bucket_count = local_340._M_bucket_count;
      local_268._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_268._M_element_count = local_340._M_element_count;
      local_268._M_rehash_policy._4_4_ = local_340._M_rehash_policy._4_4_;
      local_268._M_rehash_policy._M_max_load_factor = local_340._M_rehash_policy._M_max_load_factor;
      local_268._M_rehash_policy._M_next_resize = local_340._M_rehash_policy._M_next_resize;
      local_268._M_single_bucket = (__node_base_ptr)0x0;
      local_230._M_h = (__hashtable_alloc *)&local_268;
      std::
      _Hashtable<Data<8u>,std::pair<Data<8u>const,int>,std::allocator<std::pair<Data<8u>const,int>>,std::__detail::_Select1st,std::equal_to<Data<8u>>,My_Hash<8u>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::
      _M_assign<std::_Hashtable<Data<8u>,std::pair<Data<8u>const,int>,std::allocator<std::pair<Data<8u>const,int>>,std::__detail::_Select1st,std::equal_to<Data<8u>>,My_Hash<8u>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<Data<8u>const,int>,true>>>>
                ((_Hashtable<Data<8u>,std::pair<Data<8u>const,int>,std::allocator<std::pair<Data<8u>const,int>>,std::__detail::_Select1st,std::equal_to<Data<8u>>,My_Hash<8u>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)&local_268,&local_340,&local_230);
      (*(pWVar9->super_Abstract<8U>)._vptr_Abstract[6])(pWVar9,&local_268,&local_308);
      std::
      _Hashtable<Data<8U>,_std::pair<const_Data<8U>,_int>,_std::allocator<std::pair<const_Data<8U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<8U>_>,_My_Hash<8U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&local_268);
      lVar17 = lVar17 + 1;
    } while (lVar17 != 4);
    std::ofstream::ofstream(&local_230);
    uVar19 = local_278;
    lVar17 = 0;
    do {
      printf("\x1b[0m\x1b[1;36m|\x1b[0m\t");
      Abstract<8U>::print_f1
                (&(&local_2b8)[lVar17]->super_Abstract<8U>,(ofstream *)&local_230,(int)uVar19);
      lVar17 = lVar17 + 1;
    } while (lVar17 != 4);
    lVar17 = 0;
    do {
      if ((&local_2b8)[lVar17] != (WavingSketch<8U,_16U,_8U> *)0x0) {
        (*((&local_2b8)[lVar17]->super_Abstract<8U>)._vptr_Abstract[9])();
      }
      puVar6 = local_300;
      lVar17 = lVar17 + 1;
      puVar16 = local_308;
    } while (lVar17 != 4);
    for (; puVar16 != puVar6; puVar16 = puVar16 + 1) {
      cVar4 = (char)(long *)*puVar16;
      std::ios::widen((char)*(undefined8 *)(*(long *)*puVar16 + -0x18) + cVar4);
      std::ostream::put(cVar4);
      std::ostream::flush();
    }
    local_230._M_h = local_288;
    *(undefined8 *)((long)&local_230._M_h + *(long *)(local_288 + -0x18)) = local_290;
    std::filebuf::~filebuf((filebuf *)&local_228);
    std::ios_base::~ios_base(local_138);
    std::
    _Hashtable<Data<8U>,_std::pair<const_Data<8U>,_int>,_std::allocator<std::pair<const_Data<8U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<8U>_>,_My_Hash<8U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_378);
    std::
    _Hashtable<Data<8U>,_std::pair<const_Data<8U>,_int>,_std::allocator<std::pair<const_Data<8U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<8U>_>,_My_Hash<8U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_340);
    lVar17 = local_280;
    if (local_280 == 5) {
      free(local_2c8);
      if (local_2e8[0] != local_2d8) {
        operator_delete(local_2e8[0],local_2d8[0] + 1);
      }
      if (local_308 != (undefined8 *)0x0) {
        operator_delete(local_308,(long)local_2f8 - (long)local_308);
      }
      return;
    }
  } while( true );
}

Assistant:

void Persistent_Test_Hitter(string PATH) {
	std::vector<std::ostream*> outs(4);
	std::string file = "caida";
	outs[0] = new std::ofstream(RESULT_FOLDER + "persistent_" + file + "_Recall Rate (RR).csv");
	outs[1] = new std::ofstream(RESULT_FOLDER + "persistent_" + file + "_Precision Rate (PR).csv");
	outs[2] = new std::ofstream(RESULT_FOLDER + "persistent_" + file + "_F1.csv");
	outs[3] = new std::ofstream(RESULT_FOLDER + "persistent_" + file + "_ARE.csv");
	int cnt;
	auto records = read_standard_data<DATA_LEN>(PATH.c_str(), record_length, &cnt);
	cnt = std::min(cnt, MAX_PACKET);
	for (int i = 0; i < 5; ++i) {
		constexpr int SKETCH_NUM = 4;
		int memory = Persistent_BLOCK * (i + 1);
		printf("\033[0m\033[1;4;36m> Memory size: %dKB\n\033[0m", memory / 1000);
		Abstract<DATA_LEN>* sketch[SKETCH_NUM];
		sketch[0] = new WavingSketch<8, 16, DATA_LEN>(memory, Persistent_HIT);
		sketch[1] = new Small_Space<DATA_LEN>(memory, Persistent_HIT);
		sketch[2] = new PIE<DATA_LEN>(memory * 200, Persistent_HIT, 1600);
		sketch[3] = new OO_FPI<DATA_LEN>(memory, Persistent_HIT);
		if (i == 0)
		{
			for (auto& out : outs)
			{
				*out << "MEM(KB)" << ",";
				for (uint32_t j = 0; j < SKETCH_NUM; j++)
				{
					*out << sketch[j]->name << ",";
				}
				*out << std::endl;
			}
		}
		for (auto& out : outs)
		{
			*out << memory / 1000 << ",";
		}
		HashMap<DATA_LEN> mp;
		HashMap<DATA_LEN> cycle;
		Data<DATA_LEN> packet;
		uint num = 0;
		uint time = 0;
		// int t;

		while (num < cnt) {
			packet = records[num];
			if (num % 19537 == 0) {
				time += 1;
				cycle.clear();
			}
			num++;

			if (mp.find(packet) == mp.end()) {
				mp[packet] = 1;
				cycle[packet] = 1;
			}
			else if (cycle.find(packet) == cycle.end()) {
				cycle[packet] = 1;
				mp[packet] += 1;
			}

			for (int j = 0; j < SKETCH_NUM; ++j) {
				sketch[j]->Init(packet, time);
			}
		}

		for (int j = 0; j < SKETCH_NUM; ++j) {
			sketch[j]->Check(mp, outs);
		}

		ofstream out;

		for (int j = 0; j < SKETCH_NUM; ++j) {
			printf("\033[0m\033[1;36m|\033[0m\t");
			sketch[j]->print_f1(out, memory);
		}

		for (int j = 0; j < SKETCH_NUM; ++j) {
			delete sketch[j];
		}
		for (auto& out : outs)
		{
			*out << std::endl;
		}
	}
	free(records);
}